

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

void __thiscall maths::Matrix::Matrix(Matrix *this,int rows,int cols)

{
  int in_EDX;
  int in_ESI;
  Matrix *in_RDI;
  int j;
  int i;
  int local_18;
  int local_14;
  
  in_RDI->rows_ = in_ESI;
  in_RDI->cols_ = in_EDX;
  allocSpace(in_RDI);
  for (local_14 = 0; local_14 < in_RDI->rows_; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < in_RDI->cols_; local_18 = local_18 + 1) {
      in_RDI->p[local_14][local_18] = 0.0;
    }
  }
  return;
}

Assistant:

Matrix::Matrix(int rows, int cols) : rows_(rows), cols_(cols)
{
    allocSpace();
    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            p[i][j] = 0;
        }
    }
}